

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O3

mecab_dictionary_info_t * __thiscall
MeCab::FreeList<mecab_dictionary_info_t>::alloc(FreeList<mecab_dictionary_info_t> *this)

{
  pointer *pppmVar1;
  iterator __position;
  mecab_dictionary_info_t *pmVar2;
  undefined1 auVar3 [16];
  pointer ppmVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  mecab_dictionary_info_t *local_30;
  
  uVar7 = this->pi_;
  sVar6 = this->li_;
  if (uVar7 == this->size) {
    sVar6 = sVar6 + 1;
    this->li_ = sVar6;
    this->pi_ = 0;
    uVar7 = 0;
  }
  ppmVar4 = (this->freeList).
            super__Vector_base<mecab_dictionary_info_t_*,_std::allocator<mecab_dictionary_info_t_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->freeList).
       super__Vector_base<mecab_dictionary_info_t_*,_std::allocator<mecab_dictionary_info_t_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (sVar6 == (long)__position._M_current - (long)ppmVar4 >> 3) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = this->size;
    uVar5 = 0xffffffffffffffff;
    if (SUB168(auVar3 * ZEXT816(0x30),8) == 0) {
      uVar5 = SUB168(auVar3 * ZEXT816(0x30),0);
    }
    local_30 = (mecab_dictionary_info_t *)operator_new__(uVar5);
    if (__position._M_current ==
        (this->freeList).
        super__Vector_base<mecab_dictionary_info_t_*,_std::allocator<mecab_dictionary_info_t_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<mecab_dictionary_info_t*,std::allocator<mecab_dictionary_info_t*>>::
      _M_realloc_insert<mecab_dictionary_info_t*>
                ((vector<mecab_dictionary_info_t*,std::allocator<mecab_dictionary_info_t*>> *)
                 &this->freeList,__position,&local_30);
      uVar7 = this->pi_;
      sVar6 = this->li_;
    }
    else {
      *__position._M_current = local_30;
      pppmVar1 = &(this->freeList).
                  super__Vector_base<mecab_dictionary_info_t_*,_std::allocator<mecab_dictionary_info_t_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppmVar1 = *pppmVar1 + 1;
    }
    ppmVar4 = (this->freeList).
              super__Vector_base<mecab_dictionary_info_t_*,_std::allocator<mecab_dictionary_info_t_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  pmVar2 = ppmVar4[sVar6];
  this->pi_ = uVar7 + 1;
  return pmVar2 + uVar7;
}

Assistant:

T* alloc() {
    if (pi_ == size) {
      li_++;
      pi_ = 0;
    }
    if (li_ == freeList.size()) freeList.push_back(new T[size]);
    return freeList[li_] + (pi_++);
  }